

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

Promise<void> __thiscall
capnp::_::TestTailCalleeImpl::foo(TestTailCalleeImpl *this,FooContext context)

{
  StructDataBitCount *this_00;
  uint32_t value;
  PromiseNode *extraout_RDX;
  Promise<void> PVar1;
  Own<capnp::_::TestCallOrderImpl> local_d8;
  Client local_c8;
  ArrayPtr<const_char> local_b0;
  Maybe<capnp::MessageSize> local_90;
  undefined1 local_78 [8];
  Builder results;
  Reader params;
  TestTailCalleeImpl *this_local;
  FooContext context_local;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  context_local.hook = (CallContextHook *)this;
  CallContext<capnproto_test::capnp::test::TestTailCallee::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  ::getParams((Reader *)&results._builder.dataSize,
              (CallContext<capnproto_test::capnp::test::TestTailCallee::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
               *)&this_local);
  kj::Maybe<capnp::MessageSize>::Maybe(&local_90,(void *)0x0);
  CallContext<capnproto_test::capnp::test::TestTailCallee::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
  ::getResults((Builder *)local_78,
               (CallContext<capnproto_test::capnp::test::TestTailCallee::FooParams,_capnproto_test::capnp::test::TestTailCallee::TailResult>
                *)&this_local,&local_90);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_90);
  this_00 = &results._builder.dataSize;
  value = capnproto_test::capnp::test::TestTailCallee::FooParams::Reader::getI((Reader *)this_00);
  capnproto_test::capnp::test::TestTailCallee::TailResult::Builder::setI((Builder *)local_78,value);
  local_b0 = (ArrayPtr<const_char>)
             capnproto_test::capnp::test::TestTailCallee::FooParams::Reader::getT((Reader *)this_00)
  ;
  capnproto_test::capnp::test::TestTailCallee::TailResult::Builder::setT
            ((Builder *)local_78,(Reader)local_b0);
  kj::heap<capnp::_::TestCallOrderImpl>();
  capnproto_test::capnp::test::TestCallOrder::Client::Client<capnp::_::TestCallOrderImpl,void>
            (&local_c8,&local_d8);
  capnproto_test::capnp::test::TestTailCallee::TailResult::Builder::setC
            ((Builder *)local_78,&local_c8);
  capnproto_test::capnp::test::TestCallOrder::Client::~Client(&local_c8);
  kj::Own<capnp::_::TestCallOrderImpl>::~Own(&local_d8);
  kj::Promise<void>::Promise((Promise<void> *)this);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar1.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> TestTailCalleeImpl::foo(FooContext context) {
  ++callCount;

  auto params = context.getParams();
  auto results = context.getResults();

  results.setI(params.getI());
  results.setT(params.getT());
  results.setC(kj::heap<TestCallOrderImpl>());

  return kj::READY_NOW;
}